

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodeSetPtr xmlXPathNodeTrailingSorted(xmlNodeSetPtr nodes,xmlNodePtr node)

{
  int iVar1;
  xmlNodePtr local_48;
  int local_3c;
  xmlNodeSetPtr ret;
  xmlNodePtr cur;
  int l;
  int i;
  xmlNodePtr node_local;
  xmlNodeSetPtr nodes_local;
  
  nodes_local = nodes;
  if (((((node != (xmlNodePtr)0x0) &&
        (nodes_local = xmlXPathNodeSetCreate((xmlNodePtr)0x0), nodes_local != (xmlNodeSetPtr)0x0))
       && (nodes != (xmlNodeSetPtr)0x0)) &&
      ((nodes->nodeNr != 0 && (nodes->nodeTab != (xmlNodePtr *)0x0)))) &&
     (iVar1 = xmlXPathNodeSetContains(nodes,node), iVar1 != 0)) {
    if (nodes == (xmlNodeSetPtr)0x0) {
      local_3c = 0;
    }
    else {
      local_3c = nodes->nodeNr;
    }
    while (cur._4_4_ = local_3c + -1, -1 < cur._4_4_) {
      if (((nodes == (xmlNodeSetPtr)0x0) || (cur._4_4_ < 0)) || (nodes->nodeNr <= cur._4_4_)) {
        local_48 = (xmlNodePtr)0x0;
      }
      else {
        local_48 = nodes->nodeTab[cur._4_4_];
      }
      if ((local_48 == node) ||
         (iVar1 = xmlXPathNodeSetAddUnique(nodes_local,local_48), local_3c = cur._4_4_, iVar1 < 0))
      break;
    }
    xmlXPathNodeSetSort(nodes_local);
  }
  return nodes_local;
}

Assistant:

xmlNodeSetPtr
xmlXPathNodeTrailingSorted (xmlNodeSetPtr nodes, xmlNodePtr node) {
    int i, l;
    xmlNodePtr cur;
    xmlNodeSetPtr ret;

    if (node == NULL)
	return(nodes);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);
    if (xmlXPathNodeSetIsEmpty(nodes) ||
	(!xmlXPathNodeSetContains(nodes, node)))
	return(ret);

    l = xmlXPathNodeSetGetLength(nodes);
    for (i = l - 1; i >= 0; i--) {
	cur = xmlXPathNodeSetItem(nodes, i);
	if (cur == node)
	    break;
        /* TODO: Propagate memory error. */
	if (xmlXPathNodeSetAddUnique(ret, cur) < 0)
	    break;
    }
    xmlXPathNodeSetSort(ret);	/* bug 413451 */
    return(ret);
}